

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::
DerivedFunc<vkt::shaderexecutor::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
::doGetUsedFuncs(DerivedFunc<vkt::shaderexecutor::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                 *this,FuncSet *dst)

{
  pointer pSVar1;
  long *plVar2;
  Expr<tcu::Vector<float,_3>_> *pEVar3;
  size_t ndx;
  ulong uVar4;
  long lVar5;
  pair<std::_Rb_tree_iterator<const_vkt::shaderexecutor::FuncBase_*>,_bool> pVar6;
  DerivedFunc<vkt::shaderexecutor::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *local_28;
  
  initialize(this);
  local_28 = this;
  pVar6 = std::
          _Rb_tree<vkt::shaderexecutor::FuncBase_const*,vkt::shaderexecutor::FuncBase_const*,std::_Identity<vkt::shaderexecutor::FuncBase_const*>,std::less<vkt::shaderexecutor::FuncBase_const*>,std::allocator<vkt::shaderexecutor::FuncBase_const*>>
          ::_M_insert_unique<vkt::shaderexecutor::FuncBase_const*>
                    ((_Rb_tree<vkt::shaderexecutor::FuncBase_const*,vkt::shaderexecutor::FuncBase_const*,std::_Identity<vkt::shaderexecutor::FuncBase_const*>,std::less<vkt::shaderexecutor::FuncBase_const*>,std::allocator<vkt::shaderexecutor::FuncBase_const*>>
                      *)dst,(FuncBase **)&local_28);
  if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    lVar5 = 0;
    uVar4 = 0;
    while( true ) {
      pSVar1 = (this->m_body).
               super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->m_body).
                        super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 4) <= uVar4)
      break;
      plVar2 = *(long **)((long)&(pSVar1->super_SharedPtr<const_vkt::shaderexecutor::Statement>).
                                 m_ptr + lVar5);
      (**(code **)(*plVar2 + 0x20))(plVar2,dst);
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x10;
    }
    pEVar3 = (this->m_ret).super_ContainerExprPBase<tcu::Vector<float,_3>_>.
             super_ExprPBase<tcu::Vector<float,_3>_>.
             super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_3>_>_>.m_ptr;
    (*(pEVar3->super_ExprBase)._vptr_ExprBase[3])(pEVar3,dst);
  }
  return;
}

Assistant:

void						doGetUsedFuncs	(FuncSet& dst) const
	{
		initialize();
		if (dst.insert(this).second)
		{
			for (size_t ndx = 0; ndx < m_body.size(); ++ndx)
				m_body[ndx]->getUsedFuncs(dst);
			m_ret->getUsedFuncs(dst);
		}
	}